

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

PmError Pm_OpenOutput(PortMidiStream **stream,PmDeviceID outputDevice,void *outputDriverInfo,
                     int32_t bufferSize,PmTimeProcPtr time_proc,void *time_info,int32_t latency)

{
  pm_fns_type ppVar1;
  descriptor_type paVar2;
  int iVar3;
  PmError PVar4;
  pm_internal_struct *ptr;
  PmError PVar5;
  
  pm_hosterror = 0;
  *stream = (PortMidiStream *)0x0;
  PVar5 = pmInvalidDeviceId;
  if ((-1 < outputDevice) && (outputDevice < pm_descriptor_index)) {
    if ((descriptors[(uint)outputDevice].pub.output != 0) &&
       (descriptors[(uint)outputDevice].pub.opened == 0)) {
      ptr = (pm_internal_struct *)pm_alloc(0x78);
      *stream = ptr;
      if (ptr == (pm_internal_struct *)0x0) {
        PVar5 = pmInsufficientMemory;
      }
      else {
        ptr->device_id = outputDevice;
        ptr->write_flag = 1;
        ptr->time_proc = time_proc;
        if (latency != 0 && time_proc == (PmTimeProcPtr)0x0) {
          iVar3 = Pt_Started();
          if (iVar3 == 0) {
            Pt_Start(1,(PtCallback *)0x0,(void *)0x0);
          }
          ptr->time_proc = Pt_Time;
        }
        ptr->time_info = time_info;
        ptr->buffer_len = bufferSize;
        ptr->queue = (PmQueue *)0x0;
        PVar5 = pmNoData;
        if (latency < 1) {
          latency = PVar5;
        }
        ptr->latency = latency;
        ptr->sysex_in_progress = 0;
        ptr->sysex_message = 0;
        ptr->sysex_message_count = 0;
        ptr->filters = 0;
        ptr->channel_mask = 0xffff;
        ptr->sync_time = 0;
        ptr->first_message = 1;
        paVar2 = descriptors;
        ppVar1 = descriptors[(uint)outputDevice].dictionary;
        ptr->dictionary = ppVar1;
        ptr->fill_base = (uchar *)0x0;
        ptr->fill_offset_ptr = (uint32_t *)0x0;
        ptr->fill_length = 0;
        paVar2[(uint)outputDevice].internalDescriptor = ptr;
        PVar4 = (*ppVar1->open)(ptr,outputDriverInfo);
        if (PVar4 == pmNoData) {
          descriptors[(uint)outputDevice].pub.opened = 1;
        }
        else {
          *stream = (PortMidiStream *)0x0;
          descriptors[(uint)outputDevice].internalDescriptor = (void *)0x0;
          pm_free(ptr);
          PVar5 = PVar4;
        }
      }
    }
  }
  return PVar5;
}

Assistant:

PMEXPORT PmError Pm_OpenOutput(PortMidiStream** stream,
                      PmDeviceID outputDevice,
                      void *outputDriverInfo,
                      int32_t bufferSize,
                      PmTimeProcPtr time_proc,
                      void *time_info,
                      int32_t latency ) 
{
    PmInternal *midi;
    PmError err = pmNoError;
    pm_hosterror = FALSE;
    *stream =  NULL;
    
    /* arg checking */
    if (outputDevice < 0 || outputDevice >= pm_descriptor_index)
        err = pmInvalidDeviceId;
    else if (!descriptors[outputDevice].pub.output) 
        err = pmInvalidDeviceId;
    else if (descriptors[outputDevice].pub.opened)
        err = pmInvalidDeviceId;
    if (err != pmNoError) 
        goto error_return;

    /* create portMidi internal data */
    midi = (PmInternal *) pm_alloc(sizeof(PmInternal)); 
    *stream = midi;                 
    if (!midi) {
        err = pmInsufficientMemory;
        goto error_return;
    }
    midi->device_id = outputDevice;
    midi->write_flag = TRUE;
    midi->time_proc = time_proc;
    /* if latency > 0, we need a time reference. If none is provided,
       use PortTime library */
    if (time_proc == NULL && latency != 0) {
        if (!Pt_Started()) 
            Pt_Start(1, 0, 0);
        /* time_get does not take a parameter, so coerce */
        midi->time_proc = (PmTimeProcPtr) Pt_Time;
    }
    midi->time_info = time_info;
    midi->buffer_len = bufferSize;
    midi->queue = NULL; /* unused by output */
    /* if latency zero, output immediate (timestamps ignored) */
    /* if latency < 0, use 0 but don't return an error */
    if (latency < 0) latency = 0;
    midi->latency = latency;
    midi->sysex_in_progress = FALSE;
    midi->sysex_message = 0; /* unused by output */
    midi->sysex_message_count = 0; /* unused by output */
    midi->filters = 0; /* not used for output */
    midi->channel_mask = 0xFFFF;
    midi->sync_time = 0;
    midi->first_message = TRUE;
    midi->dictionary = descriptors[outputDevice].dictionary;
    midi->fill_base = NULL;
    midi->fill_offset_ptr = NULL;
    midi->fill_length = 0;
    descriptors[outputDevice].internalDescriptor = midi;
    /* open system dependent output device */
    err = (*midi->dictionary->open)(midi, outputDriverInfo);
    if (err) {
        *stream = NULL;
        descriptors[outputDevice].internalDescriptor = NULL;
        /* free portMidi data */
        pm_free(midi); 
    } else {
        /* portMidi input open successful */
        descriptors[outputDevice].pub.opened = TRUE;
    }
error_return:
    /* note: system-dependent code must set pm_hosterror and
     * pm_hosterror_text if a pmHostError occurs
     */
    return pm_errmsg(err);
}